

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O0

void ParseFriction(FScanner *sc,int keyword,void *fields)

{
  double dVar1;
  double local_38;
  double movefactor;
  double friction;
  FTerrainDef *def;
  void *fields_local;
  int keyword_local;
  FScanner *sc_local;
  
  FScanner::MustGetFloat(sc);
  dVar1 = clamp<double>((sc->Float * 100.0 * 7864.0) / 128.0 + 53249.0,0.0,65536.0);
  if (dVar1 <= 59392.0) {
    local_38 = ((dVar1 - 56116.0) * 10.0) / 128.0;
  }
  else {
    local_38 = ((65682.0 - dVar1) * 1024.0) / 4352.0 + 568.0;
  }
  if (local_38 < 32.0) {
    local_38 = 32.0;
  }
  *(double *)((long)fields + 0x38) = dVar1 / 65536.0;
  *(double *)((long)fields + 0x40) = local_38 / 65536.0;
  return;
}

Assistant:

static void ParseFriction (FScanner &sc, int keyword, void *fields)
{
	FTerrainDef *def = (FTerrainDef *)fields;
	double friction, movefactor;

	sc.MustGetFloat ();

	// These calculations should match those in P_SetSectorFriction().
	// A friction of 1.0 is equivalent to ORIG_FRICTION.

	friction = (0x1EB8*(sc.Float*100))/0x80 + 0xD001;
	friction = clamp<double> (friction, 0, 65536.);

	if (friction > ORIG_FRICTION * 65536.)	// ice
		movefactor = ((0x10092 - friction) * 1024) / 4352 + 568;
	else
		movefactor = ((friction - 0xDB34)*(0xA))/0x80;

	if (movefactor < 32)
		movefactor = 32;

	def->Friction = friction / 65536.;
	def->MoveFactor = movefactor / 65536.;
}